

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O0

rfc5444_result
schedule_msgtlv_consumer
          (rfc5444_reader_tlvblock_consumer *consumer,rfc5444_reader_tlvblock_context *tlv_context,
          avl_tree *tlv_entries)

{
  rfc5444_result local_24;
  rfc5444_result result;
  avl_tree *tlv_entries_local;
  rfc5444_reader_tlvblock_context *tlv_context_local;
  rfc5444_reader_tlvblock_consumer *consumer_local;
  
  local_24 = RFC5444_OKAY;
  tlv_context->type = RFC5444_CONTEXT_MESSAGE;
  if (consumer->start_callback != (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) {
    tlv_context->consumer = consumer;
    local_24 = (*consumer->start_callback)(tlv_context);
  }
  if (local_24 == RFC5444_OKAY) {
    local_24 = _schedule_tlvblock(consumer,tlv_context,tlv_entries,'\0');
  }
  return local_24;
}

Assistant:

static enum rfc5444_result
schedule_msgtlv_consumer(struct rfc5444_reader_tlvblock_consumer *consumer,
  struct rfc5444_reader_tlvblock_context *tlv_context, struct avl_tree *tlv_entries) {
  enum rfc5444_result result = RFC5444_OKAY;
  tlv_context->type = RFC5444_CONTEXT_MESSAGE;

  /* call start-of-context callback */
  if (consumer->start_callback) {
    /* could drop tlv, message or packet */
    tlv_context->consumer = consumer;
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
    result =
#endif
      consumer->start_callback(tlv_context);
  }

  /* call consumer for message tlv block */
  if (RFC5444_CONSUMER_DROP_ONLY(result == RFC5444_OKAY, true)) {
    /* could drop message or packet */
    result = _schedule_tlvblock(consumer, tlv_context, tlv_entries, 0);
  }
  return result;
}